

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.cpp
# Opt level: O3

void __thiscall duckdb::TaskScheduler::ExecuteForever(TaskScheduler *this,atomic<bool> *marker)

{
  unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true> *this_00;
  __int_type_conflict _Var1;
  ProducerToken *token;
  bool bVar2;
  uint uVar3;
  pointer pCVar4;
  idx_t iVar5;
  Task *pTVar6;
  __int_type_conflict1 _Var7;
  long lVar8;
  unsigned_long uVar9;
  lightweight_semaphore_t *plVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  LightweightSemaphore *this_02;
  shared_ptr<duckdb::Task,_true> task;
  optional_idx decay_delay;
  shared_ptr<duckdb::Task,_true> local_68;
  shared_ptr<duckdb::Task,_true> local_58;
  DBConfig *local_40;
  optional_idx local_38;
  
  local_40 = DBConfig::GetConfig(this->db);
  local_68.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_68.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (((marker->_M_base)._M_i & 1U) == 0) {
LAB_010278cd:
    bVar2 = Allocator::SupportsFlush();
    if (bVar2) {
      _Var1 = (this->allocator_background_threads)._M_base._M_i;
      uVar9 = NumericCastImpl<unsigned_long,_int,_false>::Convert
                        ((this->requested_thread_count).super___atomic_base<int>._M_i);
      Allocator::ThreadFlush((bool)(_Var1 & 1),0,uVar9);
      Allocator::ThreadIdle();
    }
    if (local_68.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_68.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return;
  }
  this_00 = &this->queue;
LAB_01027668:
  bVar2 = Allocator::SupportsFlush();
  if (bVar2) {
    pCVar4 = unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true>
             ::operator->(this_00);
    plVar10 = &pCVar4->semaphore;
    _Var7 = (pCVar4->semaphore).m_count.super___atomic_base<long>._M_i;
    do {
      if (_Var7 < 1) {
        bVar2 = duckdb_moodycamel::LightweightSemaphore::waitWithPartialSpinning(plVar10,500000);
        if (!bVar2) {
          _Var1 = (this->allocator_background_threads)._M_base._M_i;
          iVar5 = (this->allocator_flush_threshold).super___atomic_base<unsigned_long>._M_i;
          uVar9 = NumericCastImpl<unsigned_long,_int,_false>::Convert
                            ((this->requested_thread_count).super___atomic_base<int>._M_i);
          Allocator::ThreadFlush((bool)(_Var1 & 1),iVar5,uVar9);
          local_38 = Allocator::DecayDelay();
          if (local_38.index == 0xffffffffffffffff) {
            pCVar4 = unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true>
                     ::operator->(this_00);
            this_02 = &pCVar4->semaphore;
            _Var7 = (pCVar4->semaphore).m_count.super___atomic_base<long>._M_i;
            goto LAB_010278a7;
          }
          pCVar4 = unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true>
                   ::operator->(this_00);
          iVar5 = optional_idx::GetIndex(&local_38);
          plVar10 = &pCVar4->semaphore;
          _Var7 = (pCVar4->semaphore).m_count.super___atomic_base<long>._M_i;
          goto LAB_01027742;
        }
        break;
      }
      LOCK();
      lVar8 = (plVar10->m_count).super___atomic_base<long>._M_i;
      bVar2 = _Var7 == lVar8;
      if (bVar2) {
        (plVar10->m_count).super___atomic_base<long>._M_i = _Var7 + -1;
        lVar8 = _Var7;
      }
      UNLOCK();
      _Var7 = lVar8;
    } while (!bVar2);
  }
  else {
    pCVar4 = unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true>
             ::operator->(this_00);
    plVar10 = &pCVar4->semaphore;
    _Var7 = (pCVar4->semaphore).m_count.super___atomic_base<long>._M_i;
    do {
      if (_Var7 < 1) {
        duckdb_moodycamel::LightweightSemaphore::waitWithPartialSpinning(plVar10,-1);
        break;
      }
      LOCK();
      lVar8 = (plVar10->m_count).super___atomic_base<long>._M_i;
      bVar2 = _Var7 == lVar8;
      if (bVar2) {
        (plVar10->m_count).super___atomic_base<long>._M_i = _Var7 + -1;
        lVar8 = _Var7;
      }
      UNLOCK();
      _Var7 = lVar8;
    } while (!bVar2);
  }
  goto LAB_01027765;
  while( true ) {
    LOCK();
    lVar8 = (plVar10->m_count).super___atomic_base<long>._M_i;
    bVar2 = _Var7 == lVar8;
    if (bVar2) {
      (plVar10->m_count).super___atomic_base<long>._M_i = _Var7 + -1;
      lVar8 = _Var7;
    }
    UNLOCK();
    _Var7 = lVar8;
    if (bVar2) break;
LAB_01027742:
    if (_Var7 < 1) {
      bVar2 = duckdb_moodycamel::LightweightSemaphore::waitWithPartialSpinning
                        (plVar10,iVar5 * 1000000 + -500000);
      if (!bVar2) {
        Allocator::ThreadIdle();
        pCVar4 = unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true>
                 ::operator->(this_00);
        this_02 = &pCVar4->semaphore;
        _Var7 = (pCVar4->semaphore).m_count.super___atomic_base<long>._M_i;
        goto LAB_01027879;
      }
      break;
    }
  }
  goto LAB_01027765;
  while( true ) {
    LOCK();
    lVar8 = (this_02->m_count).super___atomic_base<long>._M_i;
    bVar2 = _Var7 == lVar8;
    if (bVar2) {
      (this_02->m_count).super___atomic_base<long>._M_i = _Var7 + -1;
      lVar8 = _Var7;
    }
    UNLOCK();
    _Var7 = lVar8;
    if (bVar2) break;
LAB_01027879:
    if (_Var7 < 1) goto LAB_010278bc;
  }
  goto LAB_01027765;
  while( true ) {
    LOCK();
    lVar8 = (this_02->m_count).super___atomic_base<long>._M_i;
    bVar2 = _Var7 == lVar8;
    if (bVar2) {
      (this_02->m_count).super___atomic_base<long>._M_i = _Var7 + -1;
      lVar8 = _Var7;
    }
    UNLOCK();
    _Var7 = lVar8;
    if (bVar2) break;
LAB_010278a7:
    if (_Var7 < 1) goto LAB_010278bc;
  }
LAB_01027765:
  pCVar4 = unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true>::
           operator->(this_00);
  bVar2 = duckdb_moodycamel::
          ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
          ::try_dequeue<duckdb::shared_ptr<duckdb::Task,true>>
                    ((ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
                      *)pCVar4,&local_68);
  if (bVar2) {
    pTVar6 = shared_ptr<duckdb::Task,_true>::operator->(&local_68);
    uVar3 = (*pTVar6->_vptr_Task[2])(pTVar6);
    switch(uVar3 & 0xff) {
    case 1:
      pTVar6 = shared_ptr<duckdb::Task,_true>::operator->(&local_68);
      optional_ptr<duckdb::ProducerToken,_true>::CheckValid(&pTVar6->token);
      token = (pTVar6->token).ptr;
      pCVar4 = unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true>
               ::operator->(this_00);
      local_58.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_68.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_58.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = local_68.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      local_68.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_68.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ConcurrentQueue::Enqueue(pCVar4,token,&local_58);
      this_01._M_pi =
           local_58.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      break;
    case 3:
      pTVar6 = shared_ptr<duckdb::Task,_true>::operator->(&local_68);
      (*pTVar6->_vptr_Task[3])(pTVar6);
    case 0:
    case 2:
      this_01._M_pi =
           local_68.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      local_68.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_68.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      break;
    default:
      goto switchD_010277ba_default;
    }
    if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01._M_pi);
    }
  }
switchD_010277ba_default:
  if (((marker->_M_base)._M_i & 1U) == 0) goto LAB_010278cd;
  goto LAB_01027668;
LAB_010278bc:
  duckdb_moodycamel::LightweightSemaphore::waitWithPartialSpinning(this_02,-1);
  goto LAB_01027765;
}

Assistant:

void TaskScheduler::ExecuteForever(atomic<bool> *marker) {
#ifndef DUCKDB_NO_THREADS
	static constexpr const int64_t INITIAL_FLUSH_WAIT = 500000; // initial wait time of 0.5s (in mus) before flushing

	auto &config = DBConfig::GetConfig(db);
	shared_ptr<Task> task;
	// loop until the marker is set to false
	while (*marker) {
		if (!Allocator::SupportsFlush()) {
			// allocator can't flush, just start an untimed wait
			queue->semaphore.wait();
		} else if (!queue->semaphore.wait(INITIAL_FLUSH_WAIT)) {
			// allocator can flush, we flush this threads outstanding allocations after it was idle for 0.5s
			Allocator::ThreadFlush(allocator_background_threads, allocator_flush_threshold,
			                       NumericCast<idx_t>(requested_thread_count.load()));
			auto decay_delay = Allocator::DecayDelay();
			if (!decay_delay.IsValid()) {
				// no decay delay specified - just wait
				queue->semaphore.wait();
			} else {
				if (!queue->semaphore.wait(UnsafeNumericCast<int64_t>(decay_delay.GetIndex()) * 1000000 -
				                           INITIAL_FLUSH_WAIT)) {
					// in total, the thread was idle for the entire decay delay (note: seconds converted to mus)
					// mark it as idle and start an untimed wait
					Allocator::ThreadIdle();
					queue->semaphore.wait();
				}
			}
		}
		if (queue->q.try_dequeue(task)) {
			auto process_mode = config.options.scheduler_process_partial ? TaskExecutionMode::PROCESS_PARTIAL
			                                                             : TaskExecutionMode::PROCESS_ALL;
			auto execute_result = task->Execute(process_mode);

			switch (execute_result) {
			case TaskExecutionResult::TASK_FINISHED:
			case TaskExecutionResult::TASK_ERROR:
				task.reset();
				break;
			case TaskExecutionResult::TASK_NOT_FINISHED: {
				// task is not finished - reschedule immediately
				auto &token = *task->token;
				queue->Enqueue(token, std::move(task));
				break;
			}
			case TaskExecutionResult::TASK_BLOCKED:
				task->Deschedule();
				task.reset();
				break;
			}
		}
	}
	// this thread will exit, flush all of its outstanding allocations
	if (Allocator::SupportsFlush()) {
		Allocator::ThreadFlush(allocator_background_threads, 0, NumericCast<idx_t>(requested_thread_count.load()));
		Allocator::ThreadIdle();
	}
#else
	throw NotImplementedException("DuckDB was compiled without threads! Background thread loop is not allowed.");
#endif
}